

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

void makeIntColumns(Matrix<Rational> *m)

{
  Rational *pRVar1;
  compare_t cVar2;
  compare_t cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  BigInteger g;
  Rational local_118;
  BigInteger local_d8;
  ulong local_b8;
  BigInteger local_b0;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  if (m->N != 0) {
    uVar9 = 0;
    do {
      BigInteger::BigInteger(&local_d8,1);
      uVar8 = uVar9;
      if (m->M != 0) {
        uVar6 = 0;
        uVar4 = 0;
        uVar5 = 0;
        local_b8 = uVar9;
        do {
          uVar7 = m->N * uVar6;
          pRVar1 = m->arr;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_118,
                     &pRVar1[uVar7 + uVar9]._denominator.digits);
          local_118._numerator.negative = pRVar1[uVar7 + uVar9]._denominator.negative;
          BigInteger::BigInteger(&local_b0,1);
          cVar2 = BigInteger::_compare(&local_118._numerator,&local_b0);
          if (local_b0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b0.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_118._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (cVar2 != CMP_EQUAL) {
            uVar7 = m->N * uVar6;
            pRVar1 = m->arr;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_118,
                       &pRVar1[uVar7 + uVar9]._denominator.digits);
            local_118._numerator.negative = pRVar1[uVar7 + uVar9]._denominator.negative;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_70.digits,&local_d8.digits);
            local_70.negative = local_d8.negative;
            uVar7 = m->N * uVar6;
            pRVar1 = m->arr;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_90.digits,&pRVar1[uVar7 + uVar9]._denominator.digits);
            local_90.negative = pRVar1[uVar7 + uVar9]._denominator.negative;
            gcd(&local_b0,&local_70,&local_90);
            operator/(&local_50,&local_118._numerator,&local_b0);
            BigInteger::operator*=(&local_d8,&local_50);
            if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_50.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_90.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_118._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_118._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          uVar7 = m->N;
          pRVar1 = m->arr;
          BigInteger::BigInteger(&local_118._numerator,0);
          BigInteger::BigInteger(&local_118._denominator,1);
          cVar2 = Rational::compare(pRVar1 + uVar7 * uVar6 + uVar9,&local_118);
          if (local_118._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118._denominator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_118._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar7 = m->N;
          pRVar1 = m->arr;
          BigInteger::BigInteger(&local_118._numerator,0);
          BigInteger::BigInteger(&local_118._denominator,1);
          cVar3 = Rational::compare(pRVar1 + uVar7 * uVar6 + uVar9,&local_118);
          if (local_118._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118._denominator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_118._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar8 = local_b8;
          uVar5 = uVar5 + (cVar2 == CMP_GREATER);
          uVar4 = uVar4 + (cVar3 == CMP_LESS);
          uVar6 = uVar6 + 1;
          uVar7 = m->M;
        } while (uVar6 < uVar7);
        if (uVar5 < uVar4) {
          BigInteger::operator-(&local_118._numerator,&local_d8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (&local_d8.digits,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_118);
          local_d8.negative = local_118._numerator.negative;
          if (local_118._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar7 = m->M;
        }
        if (uVar7 != 0) {
          uVar4 = 0;
          do {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_118,
                       &local_d8.digits);
            local_118._numerator.negative = local_d8.negative;
            BigInteger::BigInteger(&local_118._denominator,1);
            Rational::operator*=(m->arr + m->N * uVar4 + uVar9,&local_118);
            if (local_118._denominator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_118._denominator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_118._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_118._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            uVar4 = uVar4 + 1;
          } while (uVar4 < m->M);
        }
      }
      if (local_d8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar9 = uVar8 + 1;
    } while (uVar9 < m->N);
  }
  return;
}

Assistant:

void makeIntColumns(Matrix<Rational> &m)
{
    for(unsigned col = 0; col < m.width(); ++col)
    {
        BigInteger g = 1;
        unsigned pos = 0, neg = 0;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            if(m[i][col].denominator() != 1)
                g *= m[i][col].denominator() / gcd(g, m[i][col].denominator());
            pos += m[i][col] > 0;
            neg += m[i][col] < 0;
        }
        if(neg > pos)
            g = -g;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            m[i][col] *= g;
        }
    }
}